

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

ListBuilder * __thiscall
capnp::_::PointerBuilder::initList
          (ListBuilder *__return_storage_ptr__,PointerBuilder *this,ElementSize elementSize,
          ElementCount elementCount)

{
  WirePointer *ref;
  SegmentBuilder *segment;
  CapTableBuilder *capTable;
  BuilderArena *this_00;
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  undefined7 in_register_00000011;
  word *pwVar4;
  ulong uVar5;
  AllocateResult AVar6;
  anon_class_1_0_00000001 local_46;
  anon_class_1_0_00000001 local_45;
  StructDataBitCount local_44;
  ulong local_40;
  ulong local_38;
  
  uVar3 = CONCAT71(in_register_00000011,elementSize) & 0xffffffff;
  ref = this->pointer;
  segment = this->segment;
  AVar6.words = (word *)ref;
  AVar6.segment = segment;
  capTable = this->capTable;
  uVar1 = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::initListPointer(capnp::_::WirePointer*,capnp::_::SegmentBuilder*,capnp::_::CapTableBuilder*,unsigned_int,capnp::ElementSize,capnp::_::BuilderArena*)::_lambda()_1_>
                    (elementCount,&local_46);
  uVar2 = (int)CONCAT71(in_register_00000011,elementSize) * 4;
  local_44 = *(StructDataBitCount *)(BITS_PER_ELEMENT_TABLE + uVar2);
  local_40 = (ulong)*(uint *)(BITS_PER_ELEMENT_INCLUDING_PONITERS_TABLE + uVar2);
  uVar5 = uVar1 * local_40 + 0x3f >> 6;
  local_38 = uVar3;
  if ((ref->field_1).upper32Bits != 0 || (ref->offsetAndKind).value != 0) {
    WireHelpers::zeroObject(segment,capTable,ref);
  }
  pwVar4 = segment->pos;
  uVar3 = uVar5 & 0xffffffff;
  if (((long)((long)(segment->super_SegmentReader).ptr.ptr +
             ((segment->super_SegmentReader).ptr.size_ * 8 - (long)pwVar4)) >> 3 < (long)uVar3) ||
     (segment->pos = pwVar4 + uVar3, pwVar4 == (word *)0x0)) {
    this_00 = (BuilderArena *)(segment->super_SegmentReader).arena;
    uVar2 = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::allocate(capnp::_::WirePointer*&,capnp::_::SegmentBuilder*&,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::WirePointer::Kind,capnp::_::BuilderArena*)::_lambda()_1_>
                      ((int)uVar5 + 1,&local_45);
    AVar6 = BuilderArena::allocate(this_00,uVar2);
    (ref->offsetAndKind).value =
         (int)AVar6.words - *(int *)&((AVar6.segment)->super_SegmentReader).ptr.ptr & 0xfffffff8U |
         2;
    ref->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)
                   ((AVar6.segment)->super_SegmentReader).id.value;
    *(undefined4 *)&(AVar6.words)->content = 1;
    pwVar4 = AVar6.words + 1;
  }
  else {
    (ref->offsetAndKind).value = ((uint)((ulong)((long)pwVar4 - (long)ref) >> 1) & 0xfffffffc) - 3;
  }
  *(uint *)((long)&(AVar6.words)->content + 4) = uVar1 << 3 | (uint)local_38 & 0xff;
  __return_storage_ptr__->segment = AVar6.segment;
  __return_storage_ptr__->capTable = capTable;
  __return_storage_ptr__->ptr = (byte *)pwVar4;
  __return_storage_ptr__->elementCount = uVar1;
  __return_storage_ptr__->step = (BitsPerElementN<23>)local_40;
  __return_storage_ptr__->structDataSize = local_44;
  __return_storage_ptr__->structPointerCount = (ushort)((ElementSize)local_38 == POINTER);
  __return_storage_ptr__->elementSize = (ElementSize)local_38;
  return __return_storage_ptr__;
}

Assistant:

ListBuilder PointerBuilder::initList(ElementSize elementSize, ElementCount elementCount) {
  return WireHelpers::initListPointer(pointer, segment, capTable, elementCount, elementSize);
}